

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O2

int style_count(long *bits)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  
  iVar3 = 0;
  for (lVar4 = 0x10; lVar4 != 0x70; lVar4 = lVar4 + 0x10) {
    lVar1 = *(long *)((long)&style_table[0].bit + lVar4);
    uVar2 = bits[(int)(lVar1 / 0x20)];
    dVar5 = exp2((double)(lVar1 % 0x20));
    iVar3 = (iVar3 + 1) - (uint)(((long)dVar5 & uVar2) == 0);
  }
  return iVar3;
}

Assistant:

int style_count(long bits[])
{
	int count = 0;

	for (int i = 1; i < MAX_STYLE; i++)
	{
		if (IS_SET(bits, style_table[i].bit))
			count++;
	}

	return count;
}